

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cygwin.cpp
# Opt level: O0

string * fs_to_cygpath_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  string_view path_local;
  
  fs_convert_path_abi_cxx11_(__return_storage_ptr__,path,0);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_to_cygpath(std::string_view path) {
  return fs_convert_path(path, CCP_WIN_A_TO_POSIX);
}